

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_b4b9b9::SourceLineSynchronizer::syncToLine
          (SourceLineSynchronizer *this,int tokenLine)

{
  int iVar1;
  int iVar2;
  
  syncToMostRecentString(this);
  iVar1 = this->lastLine;
  iVar2 = iVar1;
  while (iVar2 < tokenLine) {
    if (0 < iVar2) {
      std::__cxx11::string::push_back((char)this->output);
      iVar2 = this->lastLine;
    }
    iVar2 = iVar2 + 1;
    this->lastLine = iVar2;
  }
  return iVar1 < tokenLine;
}

Assistant:

bool syncToLine(int tokenLine) {
        syncToMostRecentString();
        const bool newLineStarted = lastLine < tokenLine;
        for (; lastLine < tokenLine; ++lastLine) {
            if (lastLine > 0) *output += '\n';
        }
        return newLineStarted;
    }